

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_diag_sse41_128_16.c
# Opt level: O1

parasail_result_t *
parasail_sg_flags_rowcol_diag_sse41_128_16
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  ushort uVar1;
  int *piVar2;
  int *piVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  uint a;
  unkbyte10 Var10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined2 uVar13;
  undefined2 uVar14;
  undefined2 uVar15;
  undefined2 uVar16;
  undefined2 uVar17;
  undefined2 uVar18;
  undefined2 uVar19;
  undefined2 uVar20;
  int iVar21;
  int iVar22;
  parasail_result_t *ppVar23;
  int16_t *ptr;
  int16_t *ptr_00;
  int16_t *ptr_01;
  int16_t *ptr_02;
  long lVar24;
  short sVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  int iVar35;
  ulong uVar36;
  ulong uVar37;
  uint uVar38;
  ulong uVar39;
  short sVar40;
  int iVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  int16_t iVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  uint uVar51;
  ulong uVar52;
  undefined8 unaff_R15;
  short sVar53;
  undefined4 uVar54;
  short sVar59;
  short sVar60;
  short sVar61;
  short sVar62;
  short sVar63;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  short sVar58;
  short sVar64;
  undefined1 auVar57 [16];
  short sVar65;
  short sVar71;
  short sVar72;
  short sVar73;
  short sVar74;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  short sVar75;
  undefined1 auVar70 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 in_XMM10 [16];
  undefined1 in_XMM11 [16];
  ushort uVar88;
  ushort uVar90;
  ushort uVar91;
  ushort uVar92;
  ushort uVar93;
  ushort uVar94;
  ushort uVar95;
  ushort uVar96;
  undefined1 auVar89 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  __m128i vMaxHCol;
  __m128i vMaxHRow;
  short local_1b8;
  short sStack_1b6;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined8 local_168;
  undefined8 uStack_160;
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  int *local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  short sVar80;
  short sVar83;
  
  if (_s2 == (char *)0x0) {
    parasail_sg_flags_rowcol_diag_sse41_128_16_cold_7();
    return (parasail_result_t *)0x0;
  }
  uVar52 = (ulong)(uint)s2Len;
  if (s2Len < 1) {
    parasail_sg_flags_rowcol_diag_sse41_128_16_cold_6();
    return (parasail_result_t *)0x0;
  }
  if (open < 0) {
    parasail_sg_flags_rowcol_diag_sse41_128_16_cold_5();
    return (parasail_result_t *)0x0;
  }
  if (gap < 0) {
    parasail_sg_flags_rowcol_diag_sse41_128_16_cold_4();
    return (parasail_result_t *)0x0;
  }
  if (matrix == (parasail_matrix_t *)0x0) {
    parasail_sg_flags_rowcol_diag_sse41_128_16_cold_3();
    return (parasail_result_t *)0x0;
  }
  if (matrix->type == 0) {
    if (_s1 == (char *)0x0) {
      parasail_sg_flags_rowcol_diag_sse41_128_16_cold_2();
      return (parasail_result_t *)0x0;
    }
    uVar50 = (ulong)(uint)_s1Len;
    if (_s1Len < 1) {
      parasail_sg_flags_rowcol_diag_sse41_128_16_cold_1();
      return (parasail_result_t *)0x0;
    }
  }
  else {
    uVar50 = (ulong)(uint)matrix->length;
  }
  a = (uint)uVar50;
  iVar21 = a + 7;
  uVar38 = s2Len + 7;
  iVar41 = -open;
  iVar22 = matrix->min;
  iVar35 = -iVar22;
  if (iVar22 != iVar41 && SBORROW4(iVar22,iVar41) == iVar22 + open < 0) {
    iVar35 = open;
  }
  uVar27 = iVar35 - 0x7fff;
  iVar22 = matrix->max;
  auVar55 = pshuflw(ZEXT416(uVar27),ZEXT416(uVar27),0);
  uVar54 = auVar55._0_4_;
  local_1b8 = auVar55._0_2_;
  sStack_1b6 = auVar55._2_2_;
  local_b8 = 0;
  local_198 = (undefined1  [16])0x0;
  if (s1_beg == 0) {
    auVar55 = pshuflw(ZEXT416((uint)(gap * 8)),ZEXT416((uint)(gap * 8)),0);
    local_b8 = auVar55._0_4_;
  }
  local_118._0_8_ = CONCAT26(sStack_1b6,CONCAT24(local_1b8,uVar54));
  local_118._8_8_ = CONCAT26(sStack_1b6,CONCAT24(local_1b8,uVar54));
  local_128._8_8_ = local_118._8_8_;
  local_128._0_8_ = local_118._0_8_;
  local_138._8_8_ = local_118._8_8_;
  local_138._0_8_ = local_118._0_8_;
  local_188._8_8_ = local_118._8_8_;
  local_188._0_8_ = local_118._0_8_;
  local_148._8_8_ = local_118._8_8_;
  local_148._0_8_ = local_118._0_8_;
  uVar1 = (ushort)iVar41;
  sVar25 = (short)gap;
  if (s1_beg == 0) {
    local_198._8_8_ =
         (ulong)(uint)(gap * 0xfffd - open) & 0xffff | (ulong)(ushort)(uVar1 + sVar25 * -2) << 0x10
         | (ulong)(ushort)(uVar1 - sVar25) << 0x20 | (ulong)uVar1 << 0x30;
    local_198._0_8_ =
         (ulong)(uint)(gap * 0xfff9 - open) & 0xffffffff0000ffff |
         (ulong)(ushort)(sVar25 * -6 - (short)open) << 0x10 |
         (ulong)(ushort)(sVar25 * -5 - (short)open) << 0x20 |
         (ulong)(ushort)(uVar1 + sVar25 * -4) << 0x30;
  }
  uStack_b4 = local_b8;
  uStack_b0 = local_b8;
  uStack_ac = local_b8;
  ppVar23 = parasail_result_new_rowcol1(a,s2Len);
  if (ppVar23 == (parasail_result_t *)0x0) {
    return (parasail_result_t *)0x0;
  }
  ppVar23->flag =
       (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
       (uint)(s2_end != 0) << 0xf | ppVar23->flag | 0x8241002;
  uVar36 = (ulong)(s2Len + 0xe);
  ptr = parasail_memalign_int16_t(0x10,uVar36);
  ptr_00 = parasail_memalign_int16_t(0x10,uVar36);
  ptr_01 = parasail_memalign_int16_t(0x10,uVar36);
  if (ptr_01 == (int16_t *)0x0 || (ptr_00 == (int16_t *)0x0 || ptr == (int16_t *)0x0)) {
    return (parasail_result_t *)0x0;
  }
  if (matrix->type == 0) {
    ptr_02 = parasail_memalign_int16_t(0x10,(long)iVar21);
    if (ptr_02 == (int16_t *)0x0) {
      return (parasail_result_t *)0x0;
    }
    if (0 < (int)a) {
      piVar2 = matrix->mapper;
      uVar36 = 0;
      do {
        ptr_02[uVar36] = (int16_t)piVar2[(byte)_s1[uVar36]];
        uVar36 = uVar36 + 1;
      } while (uVar50 != uVar36);
    }
    iVar35 = a + 1;
    if ((int)(a + 1) < iVar21) {
      iVar35 = iVar21;
    }
    memset(ptr_02 + (int)a,0,(ulong)(~a + iVar35) * 2 + 2);
  }
  else {
    ptr_02 = (int16_t *)0x0;
  }
  auVar55 = ZEXT416((uint)CONCAT62((int6)((ulong)unaff_R15 >> 0x10),0x7ffe - (short)iVar22));
  auVar55 = pshuflw(auVar55,auVar55,0);
  auVar66 = pshuflw(ZEXT416(a),ZEXT416(a),0);
  auVar76 = pshuflw(ZEXT416((uint)s2Len),ZEXT416((uint)s2Len),0);
  local_178._0_4_ = auVar55._0_4_;
  local_178._4_4_ = local_178._0_4_;
  local_178._8_4_ = local_178._0_4_;
  local_178._12_4_ = local_178._0_4_;
  auVar55 = pshuflw(local_178,ZEXT416((uint)open),0);
  auVar78 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)gap),0);
  local_48._0_4_ = auVar66._0_4_;
  local_48._4_4_ = local_48._0_4_;
  local_48._8_4_ = local_48._0_4_;
  local_48._12_4_ = local_48._0_4_;
  auVar66._8_4_ = 0xffffffff;
  auVar66._0_8_ = 0xffffffffffffffff;
  auVar66._12_4_ = 0xffffffff;
  local_68._0_4_ = auVar76._0_4_;
  local_68._4_4_ = local_68._0_4_;
  local_68._8_4_ = local_68._0_4_;
  local_68._12_4_ = local_68._0_4_;
  local_78 = auVar55._0_4_;
  local_88 = auVar78._0_4_;
  local_98 = paddsw(local_48,auVar66);
  local_58 = paddsw(auVar66,local_68);
  piVar2 = matrix->mapper;
  uVar36 = 1;
  if (1 < s2Len) {
    uVar36 = uVar52;
  }
  uVar37 = 0;
  do {
    ptr[uVar37 + 7] = (int16_t)piVar2[(byte)_s2[uVar37]];
    uVar37 = uVar37 + 1;
  } while (uVar36 != uVar37);
  ptr[3] = 0;
  ptr[4] = 0;
  ptr[5] = 0;
  ptr[6] = 0;
  ptr[0] = 0;
  ptr[1] = 0;
  ptr[2] = 0;
  ptr[3] = 0;
  uVar26 = s2Len + 1U;
  if ((int)(s2Len + 1U) < (int)uVar38) {
    uVar26 = uVar38;
  }
  uStack_84 = local_88;
  uStack_80 = local_88;
  uStack_7c = local_88;
  uStack_74 = local_78;
  uStack_70 = local_78;
  uStack_6c = local_78;
  memset(ptr + uVar52 + 7,0,(ulong)(~s2Len + uVar26) * 2 + 2);
  uVar36 = 1;
  if (1 < s2Len) {
    uVar36 = uVar52;
  }
  iVar47 = (int16_t)uVar27;
  if (s2_beg == 0) {
    uVar37 = 0;
    iVar22 = iVar41;
    do {
      ptr_00[uVar37 + 7] = (int16_t)iVar22;
      iVar22 = iVar22 - gap;
      ptr_01[uVar37 + 7] = iVar47;
      uVar37 = uVar37 + 1;
    } while (uVar36 != uVar37);
  }
  else {
    uVar37 = 0;
    do {
      ptr_00[uVar37 + 7] = 0;
      ptr_01[uVar37 + 7] = iVar47;
      uVar37 = uVar37 + 1;
    } while (uVar36 != uVar37);
  }
  lVar24 = 0;
  do {
    ptr_00[lVar24] = iVar47;
    ptr_01[lVar24] = iVar47;
    lVar24 = lVar24 + 1;
  } while (lVar24 != 7);
  lVar24 = uVar52 + 7;
  uVar36 = uVar52;
  do {
    ptr_00[lVar24] = iVar47;
    ptr_01[lVar24] = iVar47;
    lVar24 = lVar24 + 1;
    uVar26 = (int)uVar36 + 1;
    uVar36 = (ulong)uVar26;
  } while ((int)uVar26 < (int)uVar38);
  ptr_00[6] = 0;
  uVar13 = local_178._0_2_;
  uVar14 = local_178._2_2_;
  uVar15 = local_178._4_2_;
  uVar16 = local_178._6_2_;
  uVar17 = local_178._8_2_;
  uVar18 = local_178._10_2_;
  uVar19 = local_178._12_2_;
  uVar20 = local_178._14_2_;
  sVar65 = local_1b8;
  sVar80 = sStack_1b6;
  sVar83 = local_1b8;
  sVar71 = sStack_1b6;
  sVar72 = local_1b8;
  sVar73 = sStack_1b6;
  sVar74 = local_1b8;
  sVar75 = sStack_1b6;
  sVar53 = local_178._0_2_;
  sVar58 = local_178._2_2_;
  sVar59 = local_178._4_2_;
  sVar60 = local_178._6_2_;
  sVar61 = local_178._8_2_;
  sVar62 = local_178._10_2_;
  sVar63 = local_178._12_2_;
  sVar64 = local_178._14_2_;
  if (0 < (int)a) {
    local_108 = matrix->matrix;
    uVar26 = a - 1;
    uVar36 = (ulong)uVar26;
    Var10 = CONCAT28(local_1b8,CONCAT26(sStack_1b6,CONCAT24(local_1b8,uVar54)));
    auVar55._10_2_ = sStack_1b6;
    auVar55._0_10_ = Var10;
    auVar55._12_2_ = local_1b8;
    auVar55._14_2_ = sStack_1b6;
    local_a8 = auVar55 >> 0x10;
    auVar66 = local_a8;
    local_c0 = (ulong)(s2Len - 1);
    local_c8 = 1;
    if (1 < (int)uVar38) {
      local_c8 = (ulong)uVar38;
    }
    local_d0 = uVar52 + 1;
    local_d8 = uVar52 + 2;
    local_e0 = uVar52 + 3;
    local_e8 = uVar52 + 4;
    local_f0 = uVar52 + 5;
    local_f8 = uVar52 + 6;
    auVar76 = pmovsxbw(in_XMM10,0x1020304050607);
    local_168 = local_178._0_8_;
    uStack_160 = local_178._8_8_;
    local_158 = auVar55;
    uVar37 = 0;
    do {
      iVar22 = matrix->type;
      uVar28 = (uint)uVar37;
      uVar38 = uVar28;
      if (iVar22 == 0) {
        uVar38 = (uint)ptr_02[uVar37];
      }
      uVar42 = uVar37 | 1;
      if (iVar22 == 0) {
        uVar29 = (int)ptr_02[uVar42];
      }
      else {
        uVar29 = uVar26;
        if (uVar42 < uVar50) {
          uVar29 = uVar28 | 1;
        }
      }
      uVar43 = uVar37 | 2;
      if (iVar22 == 0) {
        uVar30 = (int)ptr_02[uVar43];
      }
      else {
        uVar30 = uVar26;
        if (uVar43 < uVar50) {
          uVar30 = uVar28 | 2;
        }
      }
      uVar44 = uVar37 | 3;
      if (iVar22 == 0) {
        uVar31 = (int)ptr_02[uVar44];
      }
      else {
        uVar31 = uVar26;
        if (uVar44 < uVar50) {
          uVar31 = uVar28 | 3;
        }
      }
      uVar45 = uVar37 | 4;
      if (iVar22 == 0) {
        uVar32 = (int)ptr_02[uVar45];
      }
      else {
        uVar32 = uVar26;
        if (uVar45 < uVar50) {
          uVar32 = uVar28 | 4;
        }
      }
      uVar46 = uVar37 | 5;
      if (iVar22 == 0) {
        uVar33 = (int)ptr_02[uVar46];
      }
      else {
        uVar33 = uVar26;
        if (uVar46 < uVar50) {
          uVar33 = uVar28 | 5;
        }
      }
      uVar48 = uVar37 | 6;
      if (iVar22 == 0) {
        uVar51 = (int)ptr_02[uVar48];
      }
      else {
        uVar51 = uVar26;
        if (uVar48 < uVar50) {
          uVar51 = uVar28 | 6;
        }
      }
      iVar35 = matrix->size;
      uVar49 = uVar37 | 7;
      if (iVar22 == 0) {
        uVar34 = (int)ptr_02[uVar49];
      }
      else {
        uVar34 = uVar26;
        if (uVar49 < uVar50) {
          uVar34 = uVar28 | 7;
        }
      }
      local_100 = uVar37 + 8;
      local_a8._0_8_ = (undefined8)((unkuint10)Var10 >> 0x10);
      local_a8._8_8_ = auVar55._8_8_ >> 0x10;
      auVar78._8_8_ = local_a8._8_8_ | (ulong)(ushort)ptr_00[6] << 0x30;
      auVar78._0_8_ = local_a8._0_8_;
      ptr_00[6] = uVar1 - (short)local_100 * sVar25;
      uVar28 = iVar41 - uVar28 * gap;
      if (s1_beg != 0) {
        uVar28 = 0;
      }
      auVar98._8_8_ = local_a8._8_8_ | (ulong)uVar28 << 0x30;
      auVar98._0_8_ = local_a8._0_8_;
      auVar97._0_2_ = -(ushort)(local_98._0_2_ == auVar76._0_2_);
      auVar97._2_2_ = -(ushort)(local_98._2_2_ == auVar76._2_2_);
      auVar97._4_2_ = -(ushort)(local_98._4_2_ == auVar76._4_2_);
      auVar97._6_2_ = -(ushort)(local_98._6_2_ == auVar76._6_2_);
      auVar97._8_2_ = -(ushort)(local_98._8_2_ == auVar76._8_2_);
      auVar97._10_2_ = -(ushort)(local_98._10_2_ == auVar76._10_2_);
      auVar97._12_2_ = -(ushort)(local_98._12_2_ == auVar76._12_2_);
      auVar97._14_2_ = -(ushort)(local_98._14_2_ == auVar76._14_2_);
      uVar39 = 0;
      in_XMM11 = pmovsxbw(in_XMM11,0xfffefdfcfbfaf9);
      auVar81._4_2_ = local_1b8;
      auVar81._0_4_ = uVar54;
      auVar81._6_2_ = sStack_1b6;
      auVar81._8_2_ = local_1b8;
      auVar81._10_2_ = sStack_1b6;
      auVar81._12_2_ = local_1b8;
      auVar81._14_2_ = sStack_1b6;
      auVar87 = auVar81;
      do {
        auVar67._10_2_ = (short)local_108[(long)(int)(uVar30 * iVar35) + (long)ptr[uVar39 + 5]];
        auVar67._8_2_ = (short)local_108[(long)(int)(uVar31 * iVar35) + (long)ptr[uVar39 + 4]];
        auVar67._12_2_ = (short)local_108[(long)(int)(uVar29 * iVar35) + (long)ptr[uVar39 + 6]];
        auVar67._14_2_ = (short)local_108[(long)(int)(uVar38 * iVar35) + (long)ptr[uVar39 + 7]];
        auVar67._0_8_ =
             (ulong)(uint)local_108[(long)(int)(uVar34 * iVar35) + (long)ptr[uVar39]] &
             0xffffffff0000ffff |
             (ulong)*(ushort *)(local_108 + (long)(int)(uVar51 * iVar35) + (long)ptr[uVar39 + 1]) <<
             0x10 | (ulong)*(ushort *)
                            (local_108 + (long)(int)(uVar33 * iVar35) + (long)ptr[uVar39 + 2]) <<
                    0x20 |
             (ulong)*(ushort *)(local_108 + (long)(int)(uVar32 * iVar35) + (long)ptr[uVar39 + 3]) <<
             0x30;
        auVar56 = paddsw(auVar67,auVar78);
        auVar78._0_8_ = auVar98._2_8_;
        auVar78._8_8_ = auVar98._8_8_ >> 0x10 | (ulong)(ushort)ptr_00[uVar39 + 7] << 0x30;
        auVar84._0_8_ = auVar87._2_8_;
        auVar84._8_8_ = auVar87._8_8_ >> 0x10 | (ulong)(ushort)ptr_01[uVar39 + 7] << 0x30;
        auVar12._4_4_ = uStack_74;
        auVar12._0_4_ = local_78;
        auVar12._8_4_ = uStack_70;
        auVar12._12_4_ = uStack_6c;
        auVar67 = psubsw(auVar78,auVar12);
        auVar87._4_4_ = uStack_84;
        auVar87._0_4_ = local_88;
        auVar87._8_4_ = uStack_80;
        auVar87._12_4_ = uStack_7c;
        auVar85 = psubsw(auVar84,auVar87);
        sVar65 = auVar67._0_2_;
        sVar80 = auVar85._0_2_;
        auVar86._0_2_ = (ushort)(sVar80 < sVar65) * sVar65 | (ushort)(sVar80 >= sVar65) * sVar80;
        sVar65 = auVar67._2_2_;
        sVar80 = auVar85._2_2_;
        auVar86._2_2_ = (ushort)(sVar80 < sVar65) * sVar65 | (ushort)(sVar80 >= sVar65) * sVar80;
        sVar65 = auVar67._4_2_;
        sVar80 = auVar85._4_2_;
        auVar86._4_2_ = (ushort)(sVar80 < sVar65) * sVar65 | (ushort)(sVar80 >= sVar65) * sVar80;
        sVar65 = auVar67._6_2_;
        sVar80 = auVar85._6_2_;
        auVar86._6_2_ = (ushort)(sVar80 < sVar65) * sVar65 | (ushort)(sVar80 >= sVar65) * sVar80;
        sVar65 = auVar67._8_2_;
        sVar80 = auVar85._8_2_;
        auVar86._8_2_ = (ushort)(sVar80 < sVar65) * sVar65 | (ushort)(sVar80 >= sVar65) * sVar80;
        sVar65 = auVar67._10_2_;
        sVar80 = auVar85._10_2_;
        auVar86._10_2_ = (ushort)(sVar80 < sVar65) * sVar65 | (ushort)(sVar80 >= sVar65) * sVar80;
        sVar65 = auVar67._12_2_;
        sVar80 = auVar85._12_2_;
        sVar83 = auVar85._14_2_;
        auVar86._12_2_ = (ushort)(sVar80 < sVar65) * sVar65 | (ushort)(sVar80 >= sVar65) * sVar80;
        sVar65 = auVar67._14_2_;
        auVar86._14_2_ = (ushort)(sVar83 < sVar65) * sVar65 | (ushort)(sVar83 >= sVar65) * sVar83;
        auVar98 = psubsw(auVar98,auVar12);
        auVar81 = psubsw(auVar81,auVar87);
        sVar65 = auVar98._0_2_;
        sVar80 = auVar81._0_2_;
        auVar82._0_2_ = (ushort)(sVar80 < sVar65) * sVar65 | (ushort)(sVar80 >= sVar65) * sVar80;
        sVar65 = auVar98._2_2_;
        sVar80 = auVar81._2_2_;
        auVar82._2_2_ = (ushort)(sVar80 < sVar65) * sVar65 | (ushort)(sVar80 >= sVar65) * sVar80;
        sVar65 = auVar98._4_2_;
        sVar80 = auVar81._4_2_;
        auVar82._4_2_ = (ushort)(sVar80 < sVar65) * sVar65 | (ushort)(sVar80 >= sVar65) * sVar80;
        sVar65 = auVar98._6_2_;
        sVar80 = auVar81._6_2_;
        auVar82._6_2_ = (ushort)(sVar80 < sVar65) * sVar65 | (ushort)(sVar80 >= sVar65) * sVar80;
        sVar65 = auVar98._8_2_;
        sVar80 = auVar81._8_2_;
        auVar82._8_2_ = (ushort)(sVar80 < sVar65) * sVar65 | (ushort)(sVar80 >= sVar65) * sVar80;
        sVar65 = auVar98._10_2_;
        sVar80 = auVar81._10_2_;
        auVar82._10_2_ = (ushort)(sVar80 < sVar65) * sVar65 | (ushort)(sVar80 >= sVar65) * sVar80;
        sVar65 = auVar98._12_2_;
        sVar80 = auVar81._12_2_;
        sVar83 = auVar81._14_2_;
        auVar82._12_2_ = (ushort)(sVar80 < sVar65) * sVar65 | (ushort)(sVar80 >= sVar65) * sVar80;
        sVar65 = auVar98._14_2_;
        auVar82._14_2_ = (ushort)(sVar83 < sVar65) * sVar65 | (ushort)(sVar83 >= sVar65) * sVar83;
        uVar88 = ((short)auVar82._0_2_ < (short)auVar86._0_2_) * auVar86._0_2_ |
                 ((short)auVar82._0_2_ >= (short)auVar86._0_2_) * auVar82._0_2_;
        uVar90 = ((short)auVar82._2_2_ < (short)auVar86._2_2_) * auVar86._2_2_ |
                 ((short)auVar82._2_2_ >= (short)auVar86._2_2_) * auVar82._2_2_;
        uVar91 = ((short)auVar82._4_2_ < (short)auVar86._4_2_) * auVar86._4_2_ |
                 ((short)auVar82._4_2_ >= (short)auVar86._4_2_) * auVar82._4_2_;
        uVar92 = ((short)auVar82._6_2_ < (short)auVar86._6_2_) * auVar86._6_2_ |
                 ((short)auVar82._6_2_ >= (short)auVar86._6_2_) * auVar82._6_2_;
        uVar93 = ((short)auVar82._8_2_ < (short)auVar86._8_2_) * auVar86._8_2_ |
                 ((short)auVar82._8_2_ >= (short)auVar86._8_2_) * auVar82._8_2_;
        uVar94 = ((short)auVar82._10_2_ < (short)auVar86._10_2_) * auVar86._10_2_ |
                 ((short)auVar82._10_2_ >= (short)auVar86._10_2_) * auVar82._10_2_;
        uVar95 = ((short)auVar82._12_2_ < (short)auVar86._12_2_) * auVar86._12_2_ |
                 ((short)auVar82._12_2_ >= (short)auVar86._12_2_) * auVar82._12_2_;
        uVar96 = ((short)auVar82._14_2_ < (short)auVar86._14_2_) * auVar86._14_2_ |
                 ((short)auVar82._14_2_ >= (short)auVar86._14_2_) * auVar82._14_2_;
        sVar65 = auVar56._0_2_;
        auVar89._0_2_ =
             (ushort)((short)uVar88 < sVar65) * sVar65 | ((short)uVar88 >= sVar65) * uVar88;
        sVar65 = auVar56._2_2_;
        auVar89._2_2_ =
             (ushort)((short)uVar90 < sVar65) * sVar65 | ((short)uVar90 >= sVar65) * uVar90;
        sVar65 = auVar56._4_2_;
        auVar89._4_2_ =
             (ushort)((short)uVar91 < sVar65) * sVar65 | ((short)uVar91 >= sVar65) * uVar91;
        sVar65 = auVar56._6_2_;
        auVar89._6_2_ =
             (ushort)((short)uVar92 < sVar65) * sVar65 | ((short)uVar92 >= sVar65) * uVar92;
        sVar65 = auVar56._8_2_;
        auVar89._8_2_ =
             (ushort)((short)uVar93 < sVar65) * sVar65 | ((short)uVar93 >= sVar65) * uVar93;
        sVar65 = auVar56._10_2_;
        auVar89._10_2_ =
             (ushort)((short)uVar94 < sVar65) * sVar65 | ((short)uVar94 >= sVar65) * uVar94;
        sVar65 = auVar56._12_2_;
        auVar89._12_2_ =
             (ushort)((short)uVar95 < sVar65) * sVar65 | ((short)uVar95 >= sVar65) * uVar95;
        sVar65 = auVar56._14_2_;
        auVar89._14_2_ =
             (ushort)((short)uVar96 < sVar65) * sVar65 | ((short)uVar96 >= sVar65) * uVar96;
        sVar53 = in_XMM11._0_2_;
        auVar85._0_2_ = -(ushort)(sVar53 == -1);
        sVar58 = in_XMM11._2_2_;
        auVar85._2_2_ = -(ushort)(sVar58 == -1);
        sVar59 = in_XMM11._4_2_;
        auVar85._4_2_ = -(ushort)(sVar59 == -1);
        sVar60 = in_XMM11._6_2_;
        auVar85._6_2_ = -(ushort)(sVar60 == -1);
        sVar61 = in_XMM11._8_2_;
        auVar85._8_2_ = -(ushort)(sVar61 == -1);
        sVar62 = in_XMM11._10_2_;
        auVar85._10_2_ = -(ushort)(sVar62 == -1);
        sVar63 = in_XMM11._12_2_;
        sVar64 = in_XMM11._14_2_;
        auVar85._12_2_ = -(ushort)(sVar63 == -1);
        auVar85._14_2_ = -(ushort)(sVar64 == -1);
        auVar98 = pblendvb(auVar89,local_198,auVar85);
        auVar56._4_2_ = local_1b8;
        auVar56._0_4_ = uVar54;
        auVar56._6_2_ = sStack_1b6;
        auVar56._8_2_ = local_1b8;
        auVar56._10_2_ = sStack_1b6;
        auVar56._12_2_ = local_1b8;
        auVar56._14_2_ = sStack_1b6;
        auVar87 = pblendvb(auVar86,auVar56,auVar85);
        auVar81 = pblendvb(auVar82,auVar56,auVar85);
        sVar65 = auVar98._0_2_;
        sVar80 = auVar98._2_2_;
        sVar75 = auVar98._14_2_;
        sVar72 = auVar98._8_2_;
        sVar73 = auVar98._10_2_;
        sVar74 = auVar98._12_2_;
        sVar83 = auVar98._4_2_;
        sVar71 = auVar98._6_2_;
        if (7 < uVar39) {
          bVar4 = sVar65 < (short)local_168;
          uVar88 = (ushort)!bVar4 * (short)local_168;
          bVar5 = sVar80 < local_168._2_2_;
          uVar90 = (ushort)!bVar5 * local_168._2_2_;
          bVar6 = sVar83 < local_168._4_2_;
          uVar91 = (ushort)!bVar6 * local_168._4_2_;
          bVar7 = sVar72 < (short)uStack_160;
          uVar92 = (ushort)!bVar7 * (short)uStack_160;
          bVar8 = sVar73 < uStack_160._2_2_;
          uVar93 = (ushort)!bVar8 * uStack_160._2_2_;
          bVar9 = sVar74 < uStack_160._4_2_;
          uVar94 = (ushort)!bVar9 * uStack_160._4_2_;
          local_168 = CONCAT26((ushort)(sVar71 < local_168._6_2_) * sVar71 |
                               (ushort)(sVar71 >= local_168._6_2_) * local_168._6_2_,
                               CONCAT24((ushort)bVar6 * sVar83 | uVar91,
                                        CONCAT22((ushort)bVar5 * sVar80 | uVar90,
                                                 (ushort)bVar4 * sVar65 | uVar88)));
          uStack_160 = CONCAT26((ushort)(sVar75 < uStack_160._6_2_) * sVar75 |
                                (ushort)(sVar75 >= uStack_160._6_2_) * uStack_160._6_2_,
                                CONCAT24((ushort)bVar9 * sVar74 | uVar94,
                                         CONCAT22((ushort)bVar8 * sVar73 | uVar93,
                                                  (ushort)bVar7 * sVar72 | uVar92)));
          local_158._2_2_ =
               (ushort)((short)local_158._2_2_ < sVar80) * sVar80 |
               (ushort)((short)local_158._2_2_ >= sVar80) * local_158._2_2_;
          local_158._0_2_ =
               (ushort)((short)local_158._0_2_ < sVar65) * sVar65 |
               (ushort)((short)local_158._0_2_ >= sVar65) * local_158._0_2_;
          local_158._4_2_ =
               (ushort)((short)local_158._4_2_ < sVar83) * sVar83 |
               (ushort)((short)local_158._4_2_ >= sVar83) * local_158._4_2_;
          local_158._6_2_ =
               (ushort)((short)local_158._6_2_ < sVar71) * sVar71 |
               (ushort)((short)local_158._6_2_ >= sVar71) * local_158._6_2_;
          local_158._8_2_ =
               (ushort)((short)local_158._8_2_ < sVar72) * sVar72 |
               (ushort)((short)local_158._8_2_ >= sVar72) * local_158._8_2_;
          local_158._10_2_ =
               (ushort)((short)local_158._10_2_ < sVar73) * sVar73 |
               (ushort)((short)local_158._10_2_ >= sVar73) * local_158._10_2_;
          local_158._12_2_ =
               (ushort)((short)local_158._12_2_ < sVar74) * sVar74 |
               (ushort)((short)local_158._12_2_ >= sVar74) * local_158._12_2_;
          local_158._14_2_ =
               (ushort)((short)local_158._14_2_ < sVar75) * sVar75 |
               (ushort)((short)local_158._14_2_ >= sVar75) * local_158._14_2_;
        }
        piVar2 = ((ppVar23->field_4).rowcols)->score_row;
        piVar3 = ((ppVar23->field_4).rowcols)->score_col;
        if (uVar37 == uVar36 && uVar39 < uVar52) {
          piVar2[uVar39] = (int)sVar75;
        }
        if (s2Len - 1 == uVar39) {
          piVar3[uVar37] = (int)sVar75;
        }
        if (uVar39 - 1 < uVar52 && uVar42 == uVar36) {
          piVar2[uVar39 - 1] = (int)sVar74;
        }
        if (uVar52 == uVar39 && uVar42 < uVar50) {
          piVar3[uVar42] = (int)sVar74;
        }
        if ((uVar43 == uVar36) && ((long)(uVar39 - 2) < (long)uVar52 && 1 < uVar39)) {
          piVar2[uVar39 - 2] = (int)sVar73;
        }
        if (uVar52 + 1 == uVar39 && uVar43 < uVar50) {
          piVar3[uVar43] = (int)sVar73;
        }
        if ((uVar44 == uVar36) && ((long)(uVar39 - 3) < (long)uVar52 && 2 < uVar39)) {
          piVar2[uVar39 - 3] = (int)sVar72;
        }
        if (uVar52 + 2 == uVar39 && uVar44 < uVar50) {
          piVar3[uVar44] = (int)sVar72;
        }
        if ((uVar45 == uVar36) && ((long)(uVar39 - 4) < (long)uVar52 && 3 < uVar39)) {
          piVar2[uVar39 - 4] = (int)sVar71;
        }
        if (uVar52 + 3 == uVar39 && uVar45 < uVar50) {
          piVar3[uVar45] = (int)sVar71;
        }
        if ((uVar46 == uVar36) && ((long)(uVar39 - 5) < (long)uVar52 && 4 < uVar39)) {
          piVar2[uVar39 - 5] = (int)sVar83;
        }
        if (uVar52 + 4 == uVar39 && uVar46 < uVar50) {
          piVar3[uVar46] = (int)sVar83;
        }
        if ((uVar48 == uVar36) && ((long)(uVar39 - 6) < (long)uVar52 && 5 < uVar39)) {
          piVar2[uVar39 - 6] = (int)sVar80;
        }
        if (uVar52 + 5 == uVar39 && uVar48 < uVar50) {
          piVar3[uVar48] = (int)sVar80;
        }
        if ((uVar49 == uVar36) && ((long)(uVar39 - 7) < (long)uVar52 && 6 < uVar39)) {
          piVar2[uVar39 - 7] = (int)sVar65;
        }
        if (uVar52 + 6 == uVar39 && uVar49 < uVar50) {
          piVar3[uVar49] = (int)sVar65;
        }
        ptr_00[uVar39] = sVar65;
        ptr_01[uVar39] = auVar87._0_2_;
        auVar68._0_2_ = -(ushort)(auVar76._0_2_ < (short)local_48._0_2_);
        auVar68._2_2_ = -(ushort)(auVar76._2_2_ < (short)local_48._2_2_);
        auVar68._4_2_ = -(ushort)(auVar76._4_2_ < (short)local_48._4_2_);
        auVar68._6_2_ = -(ushort)(auVar76._6_2_ < (short)local_48._6_2_);
        auVar68._8_2_ = -(ushort)(auVar76._8_2_ < (short)local_48._8_2_);
        auVar68._10_2_ = -(ushort)(auVar76._10_2_ < (short)local_48._10_2_);
        auVar68._12_2_ = -(ushort)(auVar76._12_2_ < (short)local_48._12_2_);
        auVar68._14_2_ = -(ushort)(auVar76._14_2_ < (short)local_48._14_2_);
        auVar77._0_2_ = -(ushort)(local_58._0_2_ == sVar53);
        auVar77._2_2_ = -(ushort)(local_58._2_2_ == sVar58);
        auVar77._4_2_ = -(ushort)(local_58._4_2_ == sVar59);
        auVar77._6_2_ = -(ushort)(local_58._6_2_ == sVar60);
        auVar77._8_2_ = -(ushort)(local_58._8_2_ == sVar61);
        auVar77._10_2_ = -(ushort)(local_58._10_2_ == sVar62);
        auVar77._12_2_ = -(ushort)(local_58._12_2_ == sVar63);
        auVar77._14_2_ = -(ushort)(local_58._14_2_ == sVar64);
        auVar57._0_2_ = -(ushort)(sVar53 < (short)local_68._0_2_);
        auVar57._2_2_ = -(ushort)(sVar58 < (short)local_68._2_2_);
        auVar57._4_2_ = -(ushort)(sVar59 < (short)local_68._4_2_);
        auVar57._6_2_ = -(ushort)(sVar60 < (short)local_68._6_2_);
        auVar57._8_2_ = -(ushort)(sVar61 < (short)local_68._8_2_);
        auVar57._10_2_ = -(ushort)(sVar62 < (short)local_68._10_2_);
        auVar57._12_2_ = -(ushort)(sVar63 < (short)local_68._12_2_);
        auVar57._14_2_ = -(ushort)(sVar64 < (short)local_68._14_2_);
        auVar56 = psraw(in_XMM11,0xf);
        auVar79._0_2_ = -(ushort)(local_118._0_2_ < sVar65);
        auVar79._2_2_ = -(ushort)(local_118._2_2_ < sVar80);
        auVar79._4_2_ = -(ushort)(local_118._4_2_ < sVar83);
        auVar79._6_2_ = -(ushort)(local_118._6_2_ < sVar71);
        auVar79._8_2_ = -(ushort)(local_118._8_2_ < sVar72);
        auVar79._10_2_ = -(ushort)(local_118._10_2_ < sVar73);
        auVar79._12_2_ = -(ushort)(local_118._12_2_ < sVar74);
        auVar79._14_2_ = -(ushort)(local_118._14_2_ < sVar75);
        auVar79 = ~auVar56 & auVar57 & auVar97 & auVar79;
        local_118 = pblendvb(local_118,auVar89,auVar79);
        auVar69._0_2_ = -(ushort)(local_128._0_2_ < sVar65);
        auVar69._2_2_ = -(ushort)(local_128._2_2_ < sVar80);
        auVar69._4_2_ = -(ushort)(local_128._4_2_ < sVar83);
        auVar69._6_2_ = -(ushort)(local_128._6_2_ < sVar71);
        auVar69._8_2_ = -(ushort)(local_128._8_2_ < sVar72);
        auVar69._10_2_ = -(ushort)(local_128._10_2_ < sVar73);
        auVar69._12_2_ = -(ushort)(local_128._12_2_ < sVar74);
        auVar69._14_2_ = -(ushort)(local_128._14_2_ < sVar75);
        auVar69 = auVar68 & auVar77 & auVar69;
        local_128 = pblendvb(local_128,auVar98,auVar69);
        local_138 = pblendvb(local_138,auVar98,auVar77 & auVar97);
        local_188 = pblendvb(local_188,auVar76,auVar69);
        local_148 = pblendvb(local_148,in_XMM11,auVar79);
        in_XMM11 = paddsw(in_XMM11,_DAT_008d0b80);
        uVar39 = uVar39 + 1;
      } while (local_c8 != uVar39);
      auVar76 = paddsw(auVar76,_DAT_008d0b90);
      auVar11._4_4_ = uStack_b4;
      auVar11._0_4_ = local_b8;
      auVar11._8_4_ = uStack_b0;
      auVar11._12_4_ = uStack_ac;
      local_198 = psubsw(local_198,auVar11);
      uVar37 = local_100;
    } while (local_100 < uVar50);
    sVar65 = local_158._0_2_;
    sVar80 = local_158._2_2_;
    sVar83 = local_158._4_2_;
    sVar71 = local_158._6_2_;
    sVar72 = local_158._8_2_;
    sVar73 = local_158._10_2_;
    sVar74 = local_158._12_2_;
    sVar75 = local_158._14_2_;
    sVar53 = (short)local_168;
    sVar58 = local_168._2_2_;
    sVar59 = local_168._4_2_;
    sVar60 = local_168._6_2_;
    sVar61 = (short)uStack_160;
    sVar62 = uStack_160._2_2_;
    sVar63 = uStack_160._4_2_;
    sVar64 = uStack_160._6_2_;
    local_a8 = auVar66;
  }
  lVar24 = 0;
  iVar35 = 0;
  iVar22 = 0;
  uVar38 = uVar27;
  uVar26 = uVar27;
  do {
    uVar1 = *(ushort *)(local_128 + lVar24 * 2);
    if (((short)(ushort)uVar38 < (short)uVar1) ||
       ((uVar1 == (ushort)uVar38 && (*(short *)(local_188 + lVar24 * 2) < iVar35)))) {
      iVar35 = (int)*(short *)(local_188 + lVar24 * 2);
      uVar38 = (uint)uVar1;
    }
    sVar25 = (short)uVar38;
    if ((short)uVar26 < (short)*(ushort *)(local_118 + lVar24 * 2)) {
      iVar22 = (int)*(short *)(local_148 + lVar24 * 2);
      uVar26 = (uint)*(ushort *)(local_118 + lVar24 * 2);
    }
    sVar40 = (short)uVar26;
    uVar28 = (uint)*(ushort *)(local_138 + lVar24 * 2);
    if ((short)*(ushort *)(local_138 + lVar24 * 2) <= (short)uVar27) {
      uVar28 = uVar27;
    }
    uVar27 = uVar28;
    lVar24 = lVar24 + 1;
  } while ((int)lVar24 != 8);
  if (s1_end == 0 || s2_end == 0) {
    if (s1_end == 0) {
      iVar35 = a - 1;
      iVar21 = s2Len + -1;
      sVar25 = (short)uVar27;
      if (s2_end != 0) {
        iVar21 = iVar22;
        sVar25 = sVar40;
      }
      goto LAB_006e4eb2;
    }
  }
  else if ((sVar25 <= sVar40) && ((sVar25 != sVar40 || (iVar22 != s2Len + -1)))) {
    iVar35 = a - 1;
    iVar21 = iVar22;
    sVar25 = sVar40;
    goto LAB_006e4eb2;
  }
  iVar21 = s2Len + -1;
LAB_006e4eb2:
  auVar76._0_2_ = -(ushort)(sVar53 < local_1b8);
  auVar76._2_2_ = -(ushort)(sVar58 < sStack_1b6);
  auVar76._4_2_ = -(ushort)(sVar59 < local_1b8);
  auVar76._6_2_ = -(ushort)(sVar60 < sStack_1b6);
  auVar76._8_2_ = -(ushort)(sVar61 < local_1b8);
  auVar76._10_2_ = -(ushort)(sVar62 < sStack_1b6);
  auVar76._12_2_ = -(ushort)(sVar63 < local_1b8);
  auVar76._14_2_ = -(ushort)(sVar64 < sStack_1b6);
  auVar70._0_2_ = -(ushort)((short)uVar13 < sVar65);
  auVar70._2_2_ = -(ushort)((short)uVar14 < sVar80);
  auVar70._4_2_ = -(ushort)((short)uVar15 < sVar83);
  auVar70._6_2_ = -(ushort)((short)uVar16 < sVar71);
  auVar70._8_2_ = -(ushort)((short)uVar17 < sVar72);
  auVar70._10_2_ = -(ushort)((short)uVar18 < sVar73);
  auVar70._12_2_ = -(ushort)((short)uVar19 < sVar74);
  auVar70._14_2_ = -(ushort)((short)uVar20 < sVar75);
  auVar70 = auVar70 | auVar76;
  if ((((((((((((((((auVar70 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar70 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar70 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar70 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar70 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar70 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar70 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar70 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar70 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar70 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar70 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar70 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar70 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
       (auVar70 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar70 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar70[0xf] < '\0') {
    *(byte *)&ppVar23->flag = (byte)ppVar23->flag | 0x40;
    sVar25 = 0;
    iVar21 = 0;
    iVar35 = 0;
  }
  ppVar23->score = (int)sVar25;
  ppVar23->end_query = iVar35;
  ppVar23->end_ref = iVar21;
  parasail_free(ptr_01);
  parasail_free(ptr_00);
  parasail_free(ptr);
  if (matrix->type == 0) {
    parasail_free(ptr_02);
    return ppVar23;
  }
  return ppVar23;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int16_t * restrict s1 = NULL;
    int16_t * restrict s2B = NULL;
    int16_t * restrict _H_pr = NULL;
    int16_t * restrict _F_pr = NULL;
    int16_t * restrict s2 = NULL;
    int16_t * restrict H_pr = NULL;
    int16_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxHRow;
    __m128i vMaxHCol;
    __m128i vLastVal;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 8; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi16(NEG_LIMIT);
    vOpen = _mm_set1_epi16(open);
    vGap  = _mm_set1_epi16(gap);
    vOne = _mm_set1_epi16(1);
    vN = _mm_set1_epi16(N);
    vGapN = s1_beg ? _mm_set1_epi16(0) : _mm_set1_epi16(gap*N);
    vNegOne = _mm_set1_epi16(-1);
    vI = _mm_set_epi16(0,1,2,3,4,5,6,7);
    vJreset = _mm_set_epi16(0,-1,-2,-3,-4,-5,-6,-7);
    vMaxHRow = vNegInf;
    vMaxHCol = vNegInf;
    vLastVal = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi16(s1Len);
    vILimit1 = _mm_subs_epi16(vILimit, vOne);
    vJLimit = _mm_set1_epi16(s2Len);
    vJLimit1 = _mm_subs_epi16(vJLimit, vOne);
    vIBoundary = s1_beg ? _mm_set1_epi16(0) : _mm_set_epi16(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap,
            -open-4*gap,
            -open-5*gap,
            -open-6*gap,
            -open-7*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int16_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int16_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    if (s2_beg) {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = 0;
            F_pr[j] = NEG_LIMIT;
        }
    }
    else {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = -open - j*gap;
            F_pr[j] = NEG_LIMIT;
        }
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf;
        __m128i vWH = vNegInf;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        __m128i vIltLimit = _mm_cmplt_epi16(vI, vILimit);
        __m128i vIeqLimit1 = _mm_cmpeq_epi16(vI, vILimit1);
        vNH = _mm_srli_si128(vNH, 2);
        vNH = _mm_insert_epi16(vNH, H_pr[-1], 7);
        vWH = _mm_srli_si128(vWH, 2);
        vWH = _mm_insert_epi16(vWH, s1_beg ? 0 : (-open - i*gap), 7);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 2);
            vNH = _mm_insert_epi16(vNH, H_pr[j], 7);
            vF = _mm_srli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, F_pr[j], 7);
            vF = _mm_max_epi16(
                    _mm_subs_epi16(vNH, vOpen),
                    _mm_subs_epi16(vF, vGap));
            vE = _mm_max_epi16(
                    _mm_subs_epi16(vWH, vOpen),
                    _mm_subs_epi16(vE, vGap));
            vMat = _mm_set_epi16(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]]
                    );
            vNWH = _mm_adds_epi16(vNWH, vMat);
            vWH = _mm_max_epi16(vNWH, vE);
            vWH = _mm_max_epi16(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi16(vJ,vNegOne);
                vWH = _mm_blendv_epi8(vWH, vIBoundary, cond);
                vF = _mm_blendv_epi8(vF, vNegInf, cond);
                vE = _mm_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-7] = (int16_t)_mm_extract_epi16(vWH,0);
            F_pr[j-7] = (int16_t)_mm_extract_epi16(vF,0);
            /* as minor diagonal vector passes across the i or j limit
             * boundary, extract the last value of the column or row */
            {
                __m128i vJeqLimit1 = _mm_cmpeq_epi16(vJ, vJLimit1);
                __m128i vJgtNegOne = _mm_cmpgt_epi16(vJ, vNegOne);
                __m128i vJltLimit = _mm_cmplt_epi16(vJ, vJLimit);
                __m128i cond_j = _mm_and_si128(vIltLimit, vJeqLimit1);
                __m128i cond_i = _mm_and_si128(vIeqLimit1,
                        _mm_and_si128(vJgtNegOne, vJltLimit));
                __m128i cond_max_row = _mm_cmpgt_epi16(vWH, vMaxHRow);
                __m128i cond_max_col = _mm_cmpgt_epi16(vWH, vMaxHCol);
                __m128i cond_last_val = _mm_and_si128(vIeqLimit1, vJeqLimit1);
                __m128i cond_all_row = _mm_and_si128(cond_max_row, cond_i);
                __m128i cond_all_col = _mm_and_si128(cond_max_col, cond_j);
                vMaxHRow = _mm_blendv_epi8(vMaxHRow, vWH, cond_all_row);
                vMaxHCol = _mm_blendv_epi8(vMaxHCol, vWH, cond_all_col);
                vLastVal = _mm_blendv_epi8(vLastVal, vWH, cond_last_val);
                vEndI = _mm_blendv_epi8(vEndI, vI, cond_all_col);
                vEndJ = _mm_blendv_epi8(vEndJ, vJ, cond_all_row);
            }
            vJ = _mm_adds_epi16(vJ, vOne);
        }
        vI = _mm_adds_epi16(vI, vN);
        vIBoundary = _mm_subs_epi16(vIBoundary, vGapN);
    }

    /* alignment ending position */
    {
        int16_t max_row = NEG_LIMIT;
        int16_t max_col = NEG_LIMIT;
        int16_t last_val = NEG_LIMIT;
        int16_t *s = (int16_t*)&vMaxHRow;
        int16_t *t = (int16_t*)&vMaxHCol;
        int16_t *u = (int16_t*)&vLastVal;
        int16_t *i = (int16_t*)&vEndI;
        int16_t *j = (int16_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++s, ++t, ++u, ++i, ++j) {
            if (*t > max_col || (*t == max_col && *i < end_query)) {
                max_col = *t;
                end_query = *i;
            }
            if (*s > max_row) {
                max_row = *s;
                end_ref = *j;
            }
            if (*u > last_val) {
                last_val = *u;
            }
        }
        if (s1_end && s2_end) {
            if (max_col > max_row || (max_col == max_row && end_ref == s2Len-1)) {
                score = max_col;
                end_ref = s2Len-1;
            }
            else {
                score = max_row;
                end_query = s1Len-1;
            }
        }
        else if (s1_end) {
            score = max_col;
            end_ref = s2Len-1;
        }
        else if (s2_end) {
            score = max_row;
            end_query = s1Len-1;
        }
        else {
            score = last_val;
            end_query = s1Len-1;
            end_ref = s2Len-1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}